

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_loader.c
# Opt level: O0

int image_read(char *filename,loader_t *loader,uchar *image_data,int *image_width,int *image_height)

{
  handle_t *phVar1;
  handle_t *handle;
  int *image_height_local;
  int *image_width_local;
  uchar *image_data_local;
  loader_t *loader_local;
  char *filename_local;
  
  phVar1 = (*loader->init)(filename,image_width,image_height);
  if (phVar1 == (handle_t *)0x0) {
    filename_local._4_4_ = -1;
  }
  else {
    if (image_data != (uchar *)0x0) {
      (*loader->read)(phVar1,image_data);
    }
    (*loader->fini)(phVar1);
    filename_local._4_4_ = 0;
  }
  return filename_local._4_4_;
}

Assistant:

static int image_read(char *filename, loader_t *loader, unsigned char *image_data, int *image_width, int *image_height)
{
  handle_t *handle = loader->init(filename, image_width, image_height);
  if (!handle) {
    return -1;
  }
  else if (image_data) {
    loader->read(handle, image_data);
  }
  loader->fini(handle);

  return 0;
}